

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O3

void __thiscall HighsLpRelaxation::removeCuts(HighsLpRelaxation *this)

{
  int from_row;
  pointer pLVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = (this->lpsolver).model_.lp_.num_row_;
  from_row = this->mipsolver->model_->num_row_;
  Highs::deleteRows(&this->lpsolver,from_row,iVar3 + -1);
  iVar3 = iVar3 - from_row;
  if (iVar3 != 0) {
    lVar2 = (long)from_row * 0xc + 4;
    do {
      pLVar1 = (this->lprows).
               super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(int *)((long)pLVar1 + lVar2 + -4) == 1) {
        HighsCutPool::lpCutRemoved
                  (&((this->mipsolver->mipdata_)._M_t.
                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                     .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->cutpool,
                   *(HighsInt *)((long)&pLVar1->origin + lVar2));
      }
      lVar2 = lVar2 + 0xc;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::resize
            (&this->lprows,(long)from_row);
  return;
}

Assistant:

void HighsLpRelaxation::removeCuts() {
  assert(lpsolver.getLp().num_row_ ==
         (HighsInt)lpsolver.getLp().row_lower_.size());
  HighsInt nlprows = lpsolver.getNumRow();
  HighsInt modelrows = mipsolver.numRow();

  lpsolver.deleteRows(modelrows, nlprows - 1);
  for (HighsInt i = modelrows; i != nlprows; ++i) {
    if (lprows[i].origin == LpRow::Origin::kCutPool)
      mipsolver.mipdata_->cutpool.lpCutRemoved(lprows[i].index);
  }
  lprows.resize(modelrows);
  assert(lpsolver.getLp().num_row_ ==
         (HighsInt)lpsolver.getLp().row_lower_.size());
}